

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

string * __thiscall
cxxopts::values::
abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
get_default_value(string *__return_storage_ptr__,
                 abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this)

{
  abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_default_value);
  return __return_storage_ptr__;
}

Assistant:

std::string
      get_default_value() const override
      {
        return m_default_value;
      }